

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffgtcl(fitsfile *fptr,int colnum,int *typecode,long *repeat,long *width,int *status)

{
  LONGLONG *in_RCX;
  LONGLONG *in_RDX;
  undefined4 in_ESI;
  undefined8 in_RDI;
  int *in_R8;
  int *in_R9;
  LONGLONG twidth;
  LONGLONG trepeat;
  undefined8 local_48;
  undefined8 local_40;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  ffgtclll((fitsfile *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
           (int)((ulong)in_RDI >> 0x20),(int *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX,
           in_RCX,in_R8);
  if (*in_R9 < 1) {
    if (in_RCX != (LONGLONG *)0x0) {
      *in_RCX = local_40;
    }
    if (in_R8 != (int *)0x0) {
      *(undefined8 *)in_R8 = local_48;
    }
    iVar1 = *in_R9;
  }
  else {
    iVar1 = *in_R9;
  }
  return iVar1;
}

Assistant:

int ffgtcl( fitsfile *fptr,  /* I - FITS file pointer                       */
            int  colnum,     /* I - column number                           */
            int *typecode,   /* O - datatype code (21 = short, etc)         */
            long *repeat,    /* O - repeat count of field                   */
            long *width,     /* O - if ASCII, width of field or unit string */
            int  *status)    /* IO - error status                           */
/*
  Get Type of table column. 
  Returns the datatype code of the column, as well as the vector
  repeat count and (if it is an ASCII character column) the
  width of the field or a unit string within the field.  This supports the
  TFORMn = 'rAw' syntax for specifying arrays of substrings, so
  if TFORMn = '60A12' then repeat = 60 and width = 12.
*/
{
    LONGLONG trepeat, twidth;
    
    ffgtclll(fptr, colnum, typecode, &trepeat, &twidth, status);

    if (*status > 0)
        return(*status);
	
    if (repeat)
        *repeat= (long) trepeat;
      
    if (width)
        *width = (long) twidth;
    
    return(*status);
}